

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  uint fps;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t pos_1;
  undefined8 local_110;
  code *local_108;
  code *local_100;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> filenames;
  string execution_mode_string;
  string fps_string;
  path directory_path;
  string filename;
  VideoCapture video_capture;
  
  filenames.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filenames.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filenames.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::VideoCapture::VideoCapture(&video_capture);
  if (argc != 4) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Expected 3 arguments. Usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4,
                             " <path to directory with jpeg images | movie filename> <execution mode> <fps>"
                            );
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"Available execution modes: ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"1 - simple diff");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,
                             "2 - simple diff with all pixels with values different than 0 (black) set to 255 (white)"
                            );
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"3 - flicker remover on CPU");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"4 - flicker remover on GPU");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"IMPORTANT: all images and videos should be in << ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,800);
    poVar4 = std::operator<<(poVar4,"x");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,600);
    poVar4 = std::operator<<(poVar4," pixel format.");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = -1;
    goto LAB_0010fb24;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,argv[1],(allocator<char> *)&directory_path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fps_string,argv[3],(allocator<char> *)&directory_path);
  fps = std::__cxx11::stoi(&fps_string,(size_t *)&directory_path,10);
  if (directory_path._M_pathname._M_dataplus._M_p < fps_string._M_string_length) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error in <fps> command line parameter. Trailing characters after number: "
                            );
    poVar4 = std::operator<<(poVar4,(string *)&fps_string);
LAB_0010f7b4:
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = -1;
    goto LAB_0010fb0d;
  }
  if ((int)fps < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error in <fps> command line parameter. Frames per second must have a positive value."
                            );
    goto LAB_0010f7b4;
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&directory_path,&filename,auto_format);
  bVar1 = std::filesystem::is_directory(&directory_path);
  if (bVar1) {
    readFilenames(&filename,&filenames);
    if (filenames.
        super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        filenames.
        super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010f7fa;
    poVar4 = std::operator<<((ostream *)&std::cerr,"Could not find any jpeg files in directory: ");
    poVar4 = std::operator<<(poVar4,(string *)&filename);
    poVar4 = std::operator<<(poVar4,".");
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010f853:
    iVar3 = -1;
    goto LAB_0010fb00;
  }
  std::filesystem::__cxx11::path::string(&execution_mode_string,&directory_path);
  bVar2 = openVideo(&video_capture,&execution_mode_string);
  std::__cxx11::string::~string((string *)&execution_mode_string);
  if (!bVar2) goto LAB_0010f853;
LAB_0010f7fa:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&execution_mode_string,argv[2],(allocator<char> *)&pos_1);
  iVar3 = std::__cxx11::stoi(&execution_mode_string,&pos_1,10);
  if (pos_1 < execution_mode_string._M_string_length) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error in <execution mode> command line parameter. Trailing characters after number: "
                            );
    poVar4 = std::operator<<(poVar4,(string *)&execution_mode_string);
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010faf3:
    iVar3 = -1;
    goto LAB_0010faf6;
  }
  switch(iVar3) {
  case 1:
    poVar4 = std::operator<<((ostream *)&std::cout,"Simple absolute diff of 2 frames.");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (bVar1) {
      local_110 = 0;
      pos_1 = (size_t)simpleDiff;
      local_100 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_invoke;
      local_108 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar1 = iterateImages(&filenames,(function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)&pos_1);
      std::_Function_base::~_Function_base((_Function_base *)&pos_1);
      if (!bVar1) {
        pcVar5 = "Error occurred while iterating over images to produce and display diffs.";
LAB_0010fa7c:
        poVar4 = (ostream *)&std::cerr;
        goto LAB_0010fae6;
      }
    }
    else {
      local_110 = 0;
      pos_1 = (size_t)simpleDiff;
      local_100 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_invoke;
      local_108 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar1 = iterateVideoFrames(&video_capture,
                                 (function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)&pos_1);
      std::_Function_base::~_Function_base((_Function_base *)&pos_1);
      if (!bVar1) {
        pcVar5 = 
        "Error occurred while iterating over frames from video file to produce and display diffs.";
        goto LAB_0010fa7c;
      }
    }
    goto LAB_0010fac5;
  case 2:
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Simple absolute diff of 2 frames with all pixels with values ");
    poVar4 = std::operator<<(poVar4,"different than 0 (black) set to 255 (white).");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (bVar1) {
      local_110 = 0;
      pos_1 = (size_t)simpleDiffMaxed;
      local_100 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_invoke;
      local_108 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar1 = iterateImages(&filenames,(function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)&pos_1);
      std::_Function_base::~_Function_base((_Function_base *)&pos_1);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Error occurred while iterating over images to produce and display diffs with all pixels "
                                );
        pcVar5 = "with values different than 0 (black) set to 255 (white).";
        goto LAB_0010fae6;
      }
    }
    else {
      local_110 = 0;
      pos_1 = (size_t)simpleDiffMaxed;
      local_100 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_invoke;
      local_108 = std::
                  _Function_handler<bool_(const_cv::Mat_&,_const_cv::Mat_&),_bool_(*)(const_cv::Mat_&,_const_cv::Mat_&)>
                  ::_M_manager;
      bVar1 = iterateVideoFrames(&video_capture,
                                 (function<bool_(const_cv::Mat_&,_const_cv::Mat_&)> *)&pos_1);
      std::_Function_base::~_Function_base((_Function_base *)&pos_1);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Error occurred while iterating over frames from video file to produce and display diffs "
                                );
        pcVar5 = "with all pixels with values different than 0 (black) set to 255 (white).";
        goto LAB_0010fae6;
      }
    }
LAB_0010fac5:
    iVar3 = 0;
    break;
  case 3:
    poVar4 = std::operator<<((ostream *)&std::cout,"Flicker remover on CPU.");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = flickerRemoverOnCPU(bVar1,&video_capture,&filenames,fps,600,800);
    break;
  case 4:
    poVar4 = std::operator<<((ostream *)&std::cout,"Flicker remover on GPU.");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = flickerRemoverOnGPU(bVar1,&video_capture,&filenames,fps,600,800);
    break;
  default:
    poVar4 = std::operator<<((ostream *)&std::cout,"Unknown execution mode: ");
    poVar4 = std::operator<<(poVar4,(string *)&execution_mode_string);
    pcVar5 = ". It should be an integral value from range: 1 - 6.";
LAB_0010fae6:
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    goto LAB_0010faf3;
  }
LAB_0010faf6:
  std::__cxx11::string::~string((string *)&execution_mode_string);
LAB_0010fb00:
  std::filesystem::__cxx11::path::~path(&directory_path);
LAB_0010fb0d:
  std::__cxx11::string::~string((string *)&fps_string);
  std::__cxx11::string::~string((string *)&filename);
LAB_0010fb24:
  cv::VideoCapture::~VideoCapture(&video_capture);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&filenames);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    vector<path> filenames;
    VideoCapture video_capture;
    unsigned int fps;
    const int rows = 600;
    const int cols = 800;

    if(argc != 4) {
        cout << "Expected 3 arguments. Usage: " << argv[0]
             << " <path to directory with jpeg images | movie filename> <execution mode> <fps>" << endl
             << "Available execution modes: " << endl
             << "1 - simple diff" << endl
             << "2 - simple diff with all pixels with values different than 0 (black) set to 255 (white)" << endl
             << "3 - flicker remover on CPU" << endl
             << "4 - flicker remover on GPU" << endl
             << "IMPORTANT: all images and videos should be in << " << cols << "x" << rows << " pixel format." << endl;
        return -1;
    }
    string filename = argv[1];

    string fps_string = argv[3];
    try {
        size_t pos;
        int tmp_fps = stoi(fps_string, &pos);
        if(pos < fps_string.size()) {
            cerr << "Error in <fps> command line parameter. Trailing characters after number: " << fps_string << endl;
            return -1;
        } else if(tmp_fps < 0) {
            cerr << "Error in <fps> command line parameter. Frames per second must have a positive value." << endl;
            return -1;
        } else {
            fps = (unsigned int) tmp_fps;
        }
    } catch(invalid_argument const &ex) {
        cerr << "Error in <fps> command line parameter. Invalid number: " << fps_string << endl;
        return -1;
    } catch(out_of_range const &ex) {
        cerr << "Error in <fps> command line parameter. Number out of range: " << fps_string << endl;
        return -1;
    }

    auto directory_path = path(filename);
    bool images_from_dir = false;
    if(is_directory(directory_path)) {
        images_from_dir = true;
        readFilenames(filename, filenames);
        if(filenames.empty()) {
            cerr << "Could not find any jpeg files in directory: "<< filename << "." << endl;
            return -1;
        }
    } else {
        if(!openVideo(video_capture, directory_path.string())) {
            return -1;
        }
    }

    int execution_mode = 0;
    string execution_mode_string = argv[2];
    try {
        size_t pos;
        execution_mode = stoi(execution_mode_string, &pos);
        if(pos < execution_mode_string.size()) {
            cerr << "Error in <execution mode> command line parameter. Trailing characters after number: "
                 << execution_mode_string << endl;
            return -1;
        }
    } catch(invalid_argument const &ex) {
        cerr << "Error in <execution mode> command line parameter. Invalid number: " << execution_mode_string << endl;
        return -1;
    } catch(out_of_range const &ex) {
        cerr << "Error in <execution mode> command line parameter. Number out of range: "
             << execution_mode_string << endl;
        return -1;
    }

    switch(execution_mode) {
        case 1:
            cout << "Simple absolute diff of 2 frames." << endl;
            if(images_from_dir) {
                if(iterateImages(filenames, simpleDiff)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over images to produce and display diffs." << endl;
                    return -1;
                }
            } else {
                if(iterateVideoFrames(video_capture, simpleDiff)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over frames from video file to produce and display diffs."
                         << endl;
                    return -1;
                }
            }
        case 2:
            cout << "Simple absolute diff of 2 frames with all pixels with values "
                 << "different than 0 (black) set to 255 (white)." << endl;
            if(images_from_dir) {
                if(iterateImages(filenames, simpleDiffMaxed)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over images to produce and display diffs with all pixels "
                         << "with values different than 0 (black) set to 255 (white)." << endl;
                    return -1;
                }
            } else {
                if(iterateVideoFrames(video_capture, simpleDiffMaxed)) {
                    return 0;
                } else {
                    cerr << "Error occurred while iterating over frames from video file to produce and display diffs "
                         << "with all pixels with values different than 0 (black) set to 255 (white)." << endl;
                    return -1;
                }
            }
        case 3:
            cout << "Flicker remover on CPU." << endl;
            return flickerRemoverOnCPU(images_from_dir, video_capture, filenames, fps, rows, cols);
        case 4:
            cout << "Flicker remover on GPU." << endl;
            return flickerRemoverOnGPU(images_from_dir, video_capture, filenames, fps, rows, cols);
        default:
            cout << "Unknown execution mode: " << execution_mode_string
                 << ". It should be an integral value from range: 1 - 6." << endl;
            return -1;
    }
}